

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryAfter
          (Normalizer2Impl *this,uint8_t *start,uint8_t *p,UBool onlyContiguous)

{
  int32_t iVar1;
  uint local_30;
  int32_t __index;
  uint16_t norm16;
  UBool onlyContiguous_local;
  uint8_t *p_local;
  uint8_t *start_local;
  Normalizer2Impl *this_local;
  
  if (start == p) {
    this_local._7_1_ = '\x01';
  }
  else {
    local_30 = (uint)p[-1];
    if ((p[-1] & 0x80) != 0) {
      iVar1 = ucptrie_internalU8PrevIndex_63(this->normTrie,local_30,start,p + -1);
      local_30 = iVar1 >> 3;
    }
    this_local._7_1_ =
         norm16HasCompBoundaryAfter
                   (this,*(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)(int)local_30 * 2),
                    onlyContiguous);
  }
  return this_local._7_1_;
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryAfter(const uint8_t *start, const uint8_t *p,
                                            UBool onlyContiguous) const {
    if (start == p) {
        return TRUE;
    }
    uint16_t norm16;
    UCPTRIE_FAST_U8_PREV(normTrie, UCPTRIE_16, start, p, norm16);
    return norm16HasCompBoundaryAfter(norm16, onlyContiguous);
}